

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kmers.h
# Opt level: O0

void __thiscall Kmers<DNA>::ForEach(Kmers<DNA> *this,Callback *block)

{
  size_t sVar1;
  int8_t iVar2;
  unsigned_long uVar3;
  size_t sVar4;
  ulong uStack_58;
  int8_t val_1;
  size_t frame;
  size_t maxFrame;
  ulong uStack_40;
  int8_t val;
  size_t k;
  ulong uStack_30;
  Kmer kmer;
  size_t lastAmbigIndex;
  anon_class_1_0_00000001 bitMapNucleotide;
  char *pcStack_20;
  anon_class_1_0_00000001 bitIndex;
  char *ptr;
  Callback *block_local;
  Kmers<DNA> *this_local;
  
  pcStack_20 = (char *)std::__cxx11::string::data();
  uStack_30 = 0xffffffffffffffff;
  k._4_4_ = 0;
  for (uStack_40 = 0; uStack_40 < this->mLength; uStack_40 = uStack_40 + 1) {
    iVar2 = ForEach::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&lastAmbigIndex + 6),*pcStack_20);
    if (iVar2 < '\0') {
      uStack_30 = uStack_40;
    }
    else {
      uVar3 = ForEach::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&lastAmbigIndex + 7),uStack_40);
      k._4_4_ = (int)iVar2 << ((byte)uVar3 & 0x1f) | k._4_4_;
    }
    pcStack_20 = pcStack_20 + 1;
  }
  if (uStack_30 == 0xffffffffffffffff) {
    std::function<void_(unsigned_int,_unsigned_long)>::operator()(block,k._4_4_,0);
  }
  else {
    std::function<void_(unsigned_int,_unsigned_long)>::operator()(block,0xffffffff,0);
  }
  sVar4 = Sequence<DNA>::Length(this->mRef);
  sVar1 = this->mLength;
  for (uStack_58 = 1; uStack_58 <= sVar4 - sVar1; uStack_58 = uStack_58 + 1) {
    k._4_4_ = k._4_4_ >> 2;
    iVar2 = ForEach::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&lastAmbigIndex + 6),*pcStack_20);
    if (iVar2 < '\0') {
      uStack_30 = (uStack_58 + this->mLength) - 1;
    }
    else {
      uVar3 = ForEach::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)((long)&lastAmbigIndex + 7),this->mLength - 1);
      k._4_4_ = (int)iVar2 << ((byte)uVar3 & 0x1f) | k._4_4_;
    }
    if ((uStack_30 == 0xffffffffffffffff) || (uStack_30 < uStack_58)) {
      std::function<void_(unsigned_int,_unsigned_long)>::operator()(block,k._4_4_,uStack_58);
    }
    else {
      std::function<void_(unsigned_int,_unsigned_long)>::operator()(block,0xffffffff,uStack_58);
    }
    pcStack_20 = pcStack_20 + 1;
  }
  return;
}

Assistant:

void ForEach( const Callback& block ) const {
    const char* ptr = mRef.sequence.data();

    auto bitIndex = []( const size_t pos ) {
      return ( pos * BitMapPolicy< Alphabet >::NumBits ) % ( sizeof( Kmer ) * 8 );
    };

    auto bitMapNucleotide = []( const char base ) {
      return BitMapPolicy< Alphabet >::BitMap( base );
    };

    // First kmer
    size_t lastAmbigIndex = ( size_t ) -1;
    Kmer   kmer           = 0;
    for( size_t k = 0; k < mLength; k++ ) {
      int8_t val = bitMapNucleotide( *ptr );
      if( val < 0 ) {
        lastAmbigIndex = k;
      } else {
        kmer |= ( val << bitIndex( k ) );
      }
      ptr++;
    }

    if( lastAmbigIndex == ( size_t ) -1 ) {
      block( kmer, 0 );
    } else {
      block( AmbiguousKmer, 0 );
    }

    // For each consecutive kmer, shift window by one
    size_t maxFrame = mRef.Length() - mLength;
    for( size_t frame = 1; frame <= maxFrame; frame++, ptr++ ) {
      kmer >>= BitMapPolicy< Alphabet >::NumBits;
      int8_t val = bitMapNucleotide( *ptr );
      if( val < 0 ) {
        lastAmbigIndex = frame + mLength - 1;
      } else {
        kmer |= ( val << bitIndex( mLength - 1 ) );
      }

      if( lastAmbigIndex == ( size_t ) -1 || frame > lastAmbigIndex ) {
        block( kmer, frame );
      } else {
        block( AmbiguousKmer, frame );
      }
    }
  }